

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

RPCHelpMan * wallet::migratewallet(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_fffffffffffff3b8;
  vector<RPCResult,_std::allocator<RPCResult>_> *this;
  allocator<RPCResult> *this_00;
  RPCArg *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3c0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_fffffffffffff3c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff3f0;
  allocator<char> *in_stack_fffffffffffff3f8;
  char *in_stack_fffffffffffff400;
  undefined7 in_stack_fffffffffffff408;
  undefined1 in_stack_fffffffffffff40f;
  string *in_stack_fffffffffffff410;
  undefined7 in_stack_fffffffffffff418;
  undefined1 in_stack_fffffffffffff41f;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff420;
  string *in_stack_fffffffffffff428;
  undefined1 *puVar2;
  RPCArg *in_stack_fffffffffffff430;
  RPCResult *in_stack_fffffffffffff438;
  RPCResult *in_stack_fffffffffffff440;
  undefined1 *local_bb8;
  RPCExamples *examples;
  RPCResults *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  string *description;
  string *name;
  RPCHelpMan *this_02;
  allocator<char> local_a1d;
  allocator<char> local_a1c;
  allocator<char> local_a1b;
  allocator<char> local_a1a [2];
  pointer local_a18;
  pointer pRStack_a10;
  pointer local_a08;
  allocator<char> local_9fa;
  allocator<char> local_9f9 [25];
  undefined8 in_stack_fffffffffffff620;
  allocator<char> local_9ba;
  allocator<char> local_9b9 [17];
  undefined8 local_9a8;
  allocator<char> local_99a;
  allocator<char> local_999 [31];
  allocator<char> local_97a;
  undefined1 local_979 [32];
  undefined1 local_959 [5];
  undefined1 local_954;
  undefined1 local_953 [2];
  allocator<char> local_951 [31];
  allocator<char> local_932;
  allocator<char> local_931 [513];
  undefined1 local_730 [544];
  undefined1 local_510 [200];
  undefined1 local_448;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined1 local_408;
  undefined1 local_407;
  undefined1 local_360;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined1 local_320;
  undefined1 local_31f;
  undefined1 local_258 [264];
  string local_150 [8];
  undefined1 local_48 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),in_stack_fffffffffffff400
             ,in_stack_fffffffffffff3f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),in_stack_fffffffffffff400
             ,in_stack_fffffffffffff3f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),in_stack_fffffffffffff400
             ,in_stack_fffffffffffff3f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),in_stack_fffffffffffff400
             ,in_stack_fffffffffffff3f8);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<std::__cxx11::string,void,void,std::__cxx11::string,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff3c8,in_stack_fffffffffffff3c0);
  this_02 = (RPCHelpMan *)local_953;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),in_stack_fffffffffffff400
             ,in_stack_fffffffffffff3f8);
  local_360 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff3d0);
  local_338 = 0;
  uStack_330 = 0;
  local_328 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff3b8);
  local_320 = 0;
  local_31f = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff430,in_stack_fffffffffffff428,
                 (Type)((ulong)in_stack_fffffffffffff420 >> 0x20),
                 (Fallback *)CONCAT17(in_stack_fffffffffffff41f,in_stack_fffffffffffff418),
                 in_stack_fffffffffffff410,
                 (RPCArgOptions *)CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408));
  description = local_150;
  name = (string *)&local_954;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),in_stack_fffffffffffff400
             ,in_stack_fffffffffffff3f8);
  local_959._1_4_ = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_fffffffffffff3c8,(Optional *)in_stack_fffffffffffff3c0);
  args = (vector<RPCArg,_std::allocator<RPCArg>_> *)local_959;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),in_stack_fffffffffffff400
             ,in_stack_fffffffffffff3f8);
  local_448 = 0;
  std::__cxx11::string::string(in_stack_fffffffffffff3d0);
  local_420 = 0;
  uStack_418 = 0;
  local_410 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_fffffffffffff3b8);
  local_408 = 0;
  local_407 = 0;
  RPCArg::RPCArg(in_stack_fffffffffffff430,in_stack_fffffffffffff428,
                 (Type)((ulong)in_stack_fffffffffffff420 >> 0x20),
                 (Fallback *)CONCAT17(in_stack_fffffffffffff41f,in_stack_fffffffffffff418),
                 in_stack_fffffffffffff410,
                 (RPCArgOptions *)CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408));
  results = (RPCResults *)(local_979 + 0x1f);
  std::allocator<RPCArg>::allocator(in_stack_fffffffffffff3b8);
  __l._M_len._0_7_ = in_stack_fffffffffffff408;
  __l._M_array = (iterator)in_stack_fffffffffffff400;
  __l._M_len._7_1_ = in_stack_fffffffffffff40f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff3f8,__l,
             (allocator_type *)in_stack_fffffffffffff3f0);
  examples = (RPCExamples *)local_979;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),in_stack_fffffffffffff400
             ,in_stack_fffffffffffff3f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),in_stack_fffffffffffff400
             ,in_stack_fffffffffffff3f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),in_stack_fffffffffffff400
             ,in_stack_fffffffffffff3f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),in_stack_fffffffffffff400
             ,in_stack_fffffffffffff3f8);
  local_9b9[1] = (allocator<char>)0x0;
  local_9b9[2] = (allocator<char>)0x0;
  local_9b9[3] = (allocator<char>)0x0;
  local_9b9[4] = (allocator<char>)0x0;
  local_9b9[5] = (allocator<char>)0x0;
  local_9b9[6] = (allocator<char>)0x0;
  local_9b9[7] = (allocator<char>)0x0;
  local_9b9[8] = (allocator<char>)0x0;
  local_9b9[9] = (allocator<char>)0x0;
  local_9b9[10] = (allocator<char>)0x0;
  local_9b9[0xb] = (allocator<char>)0x0;
  local_9b9[0xc] = (allocator<char>)0x0;
  local_9b9[0xd] = (allocator<char>)0x0;
  local_9b9[0xe] = (allocator<char>)0x0;
  local_9b9[0xf] = (allocator<char>)0x0;
  local_9b9[0x10] = (allocator<char>)0x0;
  local_9a8._0_1_ = '\0';
  local_9a8._1_7_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff3b8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff440,(Type)((ulong)in_stack_fffffffffffff438 >> 0x20),
             &in_stack_fffffffffffff430->m_names,in_stack_fffffffffffff428,in_stack_fffffffffffff420
             ,(bool)in_stack_fffffffffffff41f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),in_stack_fffffffffffff400
             ,in_stack_fffffffffffff3f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),in_stack_fffffffffffff400
             ,in_stack_fffffffffffff3f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff3b8);
  this = (vector<RPCResult,_std::allocator<RPCResult>_> *)
         ((ulong)in_stack_fffffffffffff3b8 & 0xffffffff00000000);
  RPCResult::RPCResult
            (in_stack_fffffffffffff438,(Type)((ulong)in_stack_fffffffffffff430 >> 0x20),
             in_stack_fffffffffffff428,SUB81((ulong)in_stack_fffffffffffff420 >> 0x38,0),
             (string *)CONCAT17(in_stack_fffffffffffff41f,in_stack_fffffffffffff418),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff410,
             (bool)in_stack_fffffffffffff40f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),in_stack_fffffffffffff400
             ,in_stack_fffffffffffff3f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),in_stack_fffffffffffff400
             ,in_stack_fffffffffffff3f8);
  local_9f9[1] = (allocator<char>)0x0;
  local_9f9[2] = (allocator<char>)0x0;
  local_9f9[3] = (allocator<char>)0x0;
  local_9f9[4] = (allocator<char>)0x0;
  local_9f9[5] = (allocator<char>)0x0;
  local_9f9[6] = (allocator<char>)0x0;
  local_9f9[7] = (allocator<char>)0x0;
  local_9f9[8] = (allocator<char>)0x0;
  local_9f9[9] = (allocator<char>)0x0;
  local_9f9[10] = (allocator<char>)0x0;
  local_9f9[0xb] = (allocator<char>)0x0;
  local_9f9[0xc] = (allocator<char>)0x0;
  local_9f9[0xd] = (allocator<char>)0x0;
  local_9f9[0xe] = (allocator<char>)0x0;
  local_9f9[0xf] = (allocator<char>)0x0;
  local_9f9[0x10] = (allocator<char>)0x0;
  local_9f9[0x11] = (allocator<char>)0x0;
  local_9f9[0x12] = (allocator<char>)0x0;
  local_9f9[0x13] = (allocator<char>)0x0;
  local_9f9[0x14] = (allocator<char>)0x0;
  local_9f9[0x15] = (allocator<char>)0x0;
  local_9f9[0x16] = (allocator<char>)0x0;
  local_9f9[0x17] = (allocator<char>)0x0;
  local_9f9[0x18] = (allocator<char>)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector(this);
  this_00 = (allocator<RPCResult> *)((ulong)this & 0xffffffff00000000);
  RPCResult::RPCResult
            (in_stack_fffffffffffff438,(Type)((ulong)in_stack_fffffffffffff430 >> 0x20),
             in_stack_fffffffffffff428,SUB81((ulong)in_stack_fffffffffffff420 >> 0x38,0),
             (string *)CONCAT17(in_stack_fffffffffffff41f,in_stack_fffffffffffff418),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff410,
             (bool)in_stack_fffffffffffff40f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),in_stack_fffffffffffff400
             ,in_stack_fffffffffffff3f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),in_stack_fffffffffffff400
             ,in_stack_fffffffffffff3f8);
  local_a18 = (pointer)0x0;
  pRStack_a10 = (pointer)0x0;
  local_a08 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this_00);
  RPCResult::RPCResult
            (in_stack_fffffffffffff440,(Type)((ulong)in_stack_fffffffffffff438 >> 0x20),
             &in_stack_fffffffffffff430->m_names,in_stack_fffffffffffff428,in_stack_fffffffffffff420
             ,(bool)in_stack_fffffffffffff41f);
  std::allocator<RPCResult>::allocator(this_00);
  __l_00._M_len._0_7_ = in_stack_fffffffffffff408;
  __l_00._M_array = (iterator)in_stack_fffffffffffff400;
  __l_00._M_len._7_1_ = in_stack_fffffffffffff40f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff3f8,__l_00,
             (allocator_type *)in_stack_fffffffffffff3f0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff440,(Type)((ulong)in_stack_fffffffffffff438 >> 0x20),
             &in_stack_fffffffffffff430->m_names,in_stack_fffffffffffff428,in_stack_fffffffffffff420
             ,(bool)in_stack_fffffffffffff41f);
  RPCResults::RPCResults
            ((RPCResults *)in_stack_fffffffffffff438,(RPCResult *)in_stack_fffffffffffff430);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),in_stack_fffffffffffff400
             ,in_stack_fffffffffffff3f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),in_stack_fffffffffffff400
             ,in_stack_fffffffffffff3f8);
  HelpExampleCli(in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),in_stack_fffffffffffff400
             ,in_stack_fffffffffffff3f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffff40f,in_stack_fffffffffffff408),in_stack_fffffffffffff400
             ,in_stack_fffffffffffff3f8);
  HelpExampleRpc(in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8);
  std::operator+(in_stack_fffffffffffff3f0,in_stack_fffffffffffff3e8);
  RPCExamples::RPCExamples((RPCExamples *)this_00,(string *)0x9e323d);
  this_01 = (RPCArg *)&stack0xfffffffffffff5c0;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::migratewallet()::__0,void>
            (in_stack_fffffffffffff3c8,(anon_class_1_0_00000001 *)in_stack_fffffffffffff3c0);
  RPCHelpMan::RPCHelpMan
            (this_02,name,description,args,results,examples,
             (RPCMethodImpl *)in_stack_fffffffffffff620);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_01);
  RPCExamples::~RPCExamples((RPCExamples *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_a1d);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_a1c);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_a1b);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_a1a);
  RPCResults::~RPCResults((RPCResults *)this_01);
  RPCResult::~RPCResult((RPCResult *)this_01);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff3c8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_01);
  puVar2 = local_730;
  local_bb8 = local_510;
  do {
    local_bb8 = local_bb8 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_01);
  } while (local_bb8 != puVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff3c8);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_9fa);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_9f9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff3c8);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff626);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff627);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff3c8);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_9ba);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_9b9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff3c8);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_99a);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_999);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_97a);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_979);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff3c8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_01);
  puVar2 = local_258;
  puVar1 = local_48;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this_01);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_959);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)&local_954);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)local_953);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_953 + 1));
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_951);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_932);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_931);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan migratewallet()
{
    return RPCHelpMan{"migratewallet",
        "\nMigrate the wallet to a descriptor wallet.\n"
        "A new wallet backup will need to be made.\n"
        "\nThe migration process will create a backup of the wallet before migrating. This backup\n"
        "file will be named <wallet name>-<timestamp>.legacy.bak and can be found in the directory\n"
        "for this wallet. In the event of an incorrect migration, the backup can be restored using restorewallet."
        "\nEncrypted wallets must have the passphrase provided as an argument to this call.\n"
        "\nThis RPC may take a long time to complete. Increasing the RPC client timeout is recommended.",
        {
            {"wallet_name", RPCArg::Type::STR, RPCArg::DefaultHint{"the wallet name from the RPC endpoint"}, "The name of the wallet to migrate. If provided both here and in the RPC endpoint, the two must be identical."},
            {"passphrase", RPCArg::Type::STR, RPCArg::Optional::OMITTED, "The wallet passphrase"},
        },
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR, "wallet_name", "The name of the primary migrated wallet"},
                {RPCResult::Type::STR, "watchonly_name", /*optional=*/true, "The name of the migrated wallet containing the watchonly scripts"},
                {RPCResult::Type::STR, "solvables_name", /*optional=*/true, "The name of the migrated wallet containing solvable but not watched scripts"},
                {RPCResult::Type::STR, "backup_path", "The location of the backup of the original wallet"},
            }
        },
        RPCExamples{
            HelpExampleCli("migratewallet", "")
            + HelpExampleRpc("migratewallet", "")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            std::string wallet_name;
            if (GetWalletNameFromJSONRPCRequest(request, wallet_name)) {
                if (!(request.params[0].isNull() || request.params[0].get_str() == wallet_name)) {
                    throw JSONRPCError(RPC_INVALID_PARAMETER, "RPC endpoint wallet and wallet_name parameter specify different wallets");
                }
            } else {
                if (request.params[0].isNull()) {
                    throw JSONRPCError(RPC_INVALID_PARAMETER, "Either RPC endpoint wallet or wallet_name parameter must be provided");
                }
                wallet_name = request.params[0].get_str();
            }

            SecureString wallet_pass;
            wallet_pass.reserve(100);
            if (!request.params[1].isNull()) {
                wallet_pass = std::string_view{request.params[1].get_str()};
            }

            WalletContext& context = EnsureWalletContext(request.context);
            util::Result<MigrationResult> res = MigrateLegacyToDescriptor(wallet_name, wallet_pass, context);
            if (!res) {
                throw JSONRPCError(RPC_WALLET_ERROR, util::ErrorString(res).original);
            }

            UniValue r{UniValue::VOBJ};
            r.pushKV("wallet_name", res->wallet_name);
            if (res->watchonly_wallet) {
                r.pushKV("watchonly_name", res->watchonly_wallet->GetName());
            }
            if (res->solvables_wallet) {
                r.pushKV("solvables_name", res->solvables_wallet->GetName());
            }
            r.pushKV("backup_path", res->backup_path.utf8string());

            return r;
        },
    };
}